

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_parse.c
# Opt level: O0

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp,H264dCurCtx_t *p_Cur)

{
  MppPacket pvVar1;
  RK_U16 RVar2;
  MPP_RET MVar3;
  RK_U8 *pRVar4;
  MppPacketImpl *pkt_impl;
  RK_U8 *pdata;
  H264dCurStream_t *p_strm;
  MPP_RET ret;
  RK_S32 i;
  H264dCurCtx_t *p_Cur_local;
  H264dInputCtx_t *p_Inp_local;
  
  p_strm._0_4_ = MPP_ERR_UNKNOW;
  pRVar4 = p_Inp->in_buf;
  pvVar1 = p_Inp->in_pkt;
  if ((p_Cur->strm).nalu_buf != (RK_U8 *)0x0) {
    mpp_osal_free("parse_prepare_avcC_header",(p_Cur->strm).nalu_buf);
  }
  (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
  if (p_Inp->in_length < 7) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_parse","avcC too short, len=%d \n",(char *)0x0,p_Inp->in_length);
    }
  }
  else if (*pRVar4 == '\x01') {
    p_Inp->profile = pRVar4[1];
    p_Inp->level = pRVar4[3];
    p_Inp->nal_size = (pRVar4[4] & 3) + 1;
    p_Inp->sps_num = pRVar4[5] & 0x1f;
    pkt_impl = (MppPacketImpl *)(pRVar4 + 6);
    for (p_strm._4_4_ = 0; p_strm._4_4_ < p_Inp->sps_num; p_strm._4_4_ = p_strm._4_4_ + 1) {
      RVar2 = U16_AT((RK_U8 *)pkt_impl);
      (p_Cur->strm).nalu_len = (uint)RVar2;
      pRVar4 = (RK_U8 *)((long)&pkt_impl->name + 2);
      (p_Cur->strm).nalu_type = 7;
      (p_Cur->strm).nalu_buf = pRVar4;
      MVar3 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
      if (MVar3 < MPP_OK) {
        if ((h264d_debug & 4) == 0) {
          return MVar3;
        }
        _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x35d);
        return MVar3;
      }
      pkt_impl = (MppPacketImpl *)(pRVar4 + (p_Cur->strm).nalu_len);
    }
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    p_Inp->pps_num = (uint)*(byte *)&pkt_impl->name;
    pkt_impl = (MppPacketImpl *)((long)&pkt_impl->name + 1);
    for (p_strm._4_4_ = 0; p_strm._4_4_ < p_Inp->pps_num; p_strm._4_4_ = p_strm._4_4_ + 1) {
      RVar2 = U16_AT((RK_U8 *)pkt_impl);
      (p_Cur->strm).nalu_len = (uint)RVar2;
      pRVar4 = (RK_U8 *)((long)&pkt_impl->name + 2);
      (p_Cur->strm).nalu_type = 8;
      (p_Cur->strm).nalu_buf = pRVar4;
      MVar3 = store_cur_nalu(p_Cur,&p_Cur->strm,p_Cur->p_Dec->dxva_ctx);
      if (MVar3 < MPP_OK) {
        if ((h264d_debug & 4) == 0) {
          return MVar3;
        }
        _mpp_log_l(4,"h264d_parse","Function error(%d).\n",(char *)0x0,0x368);
        return MVar3;
      }
      pkt_impl = (MppPacketImpl *)(pRVar4 + (p_Cur->strm).nalu_len);
    }
    *(undefined8 *)((long)pvVar1 + 0x20) = 0;
    (p_Cur->strm).nalu_buf = (RK_U8 *)0x0;
    (p_Cur->strm).startcode_found = '\x01';
    p_strm._0_4_ = MPP_OK;
  }
  return (MPP_RET)p_strm;
}

Assistant:

MPP_RET parse_prepare_avcC_header(H264dInputCtx_t *p_Inp, H264dCurCtx_t *p_Cur)
{
    RK_S32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;

    H264dCurStream_t *p_strm = &p_Cur->strm;
    RK_U8 *pdata = p_Inp->in_buf;
    MppPacketImpl *pkt_impl  = (MppPacketImpl *)p_Inp->in_pkt;

    //!< free nalu_buffer
    MPP_FREE(p_strm->nalu_buf);
    if (p_Inp->in_length < 7) {
        H264D_ERR("avcC too short, len=%d \n", p_Inp->in_length);
        goto __FAILED;
    }
    if (pdata[0] != 1) {
        goto __FAILED;
    }
    p_Inp->profile = pdata[1];
    p_Inp->level = pdata[3];
    p_Inp->nal_size = 1 + (pdata[4] & 3);
    p_Inp->sps_num = pdata[5] & 31;

    pdata += 6;
    for (i = 0; i < p_Inp->sps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_SPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    p_strm->nalu_buf = NULL;
    p_Inp->pps_num = *pdata;
    ++pdata;
    for (i = 0; i < p_Inp->pps_num; ++i) {
        p_strm->nalu_len = U16_AT(pdata);
        pdata += 2;
        p_strm->nalu_type = H264_NALU_TYPE_PPS;
        p_strm->nalu_buf = pdata;
        FUN_CHECK(ret = store_cur_nalu(p_Cur, p_strm, p_Cur->p_Dec->dxva_ctx));
        pdata += p_strm->nalu_len;
    }
    pkt_impl->length = 0;
    p_strm->nalu_buf = NULL;
    p_strm->startcode_found = 1;

    ret = MPP_OK;
__FAILED:
    return ret;
}